

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStructMatrix.cpp
# Opt level: O3

void __thiscall
TPZStructMatrix::TPZStructMatrix(TPZStructMatrix *this,void **vtt,TPZAutoPointer<TPZCompMesh> *mesh)

{
  _Rb_tree_header *p_Var1;
  void *pvVar2;
  TPZReference *pTVar3;
  TPZAutoPointer<TPZCompMesh> local_30;
  
  pvVar2 = *vtt;
  *(void **)this = pvVar2;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar2 + -0x60)) = vtt[1];
  *(void **)(&this->field_0x0 + *(long *)(*(long *)this + -0x68)) = vtt[2];
  this->fMesh = (TPZCompMesh *)0x0;
  pTVar3 = (TPZReference *)operator_new(0x10);
  (pTVar3->fCounter).super___atomic_base<int>._M_i = 0;
  pTVar3->fPointer = (TPZCompMesh *)0x0;
  LOCK();
  (pTVar3->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fCompMesh).fRef = pTVar3;
  p_Var1 = &(this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header;
  (this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->fEquationFilter).super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZEquationFilter_019a2f18;
  (this->fEquationFilter).fNumEq = 0;
  (this->fEquationFilter).fIsActive = false;
  (this->fEquationFilter).fActiveEqs._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
  (this->fEquationFilter).fActiveEqs.fStore = (long *)0x0;
  (this->fEquationFilter).fActiveEqs.fNElements = 0;
  (this->fEquationFilter).fActiveEqs.fNAlloc = 0;
  (this->fEquationFilter).fDestIndices._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
  (this->fEquationFilter).fDestIndices.fStore = (long *)0x0;
  (this->fEquationFilter).fDestIndices.fNElements = 0;
  (this->fEquationFilter).fDestIndices.fNAlloc = 0;
  local_30 = (TPZAutoPointer<TPZCompMesh>)mesh->fRef;
  LOCK();
  ((local_30.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_30.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  SetMesh(this,&local_30);
  TPZAutoPointer<TPZCompMesh>::~TPZAutoPointer(&local_30);
  return;
}

Assistant:

TPZStructMatrix::TPZStructMatrix(TPZAutoPointer<TPZCompMesh> mesh)
    : TPZStrMatParInterface(), fEquationFilter(0) {
    SetMesh(mesh);
}